

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging_test.cc
# Opt level: O1

void leveldb::ConsumeDecimalNumberRoundtripTest(uint64_t number,string *padding)

{
  _Alloc_hider _Var1;
  bool b;
  uint64_t in_RDX;
  uint64_t result;
  string input_string;
  string decimal_number;
  Slice local_230;
  unsigned_long local_220;
  size_type local_218;
  uint64_t local_210;
  uint64_t local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  string local_1e0;
  Tester local_1c0;
  
  local_208 = number;
  NumberToString_abi_cxx11_(&local_1e0,(leveldb *)number,in_RDX);
  std::operator+(&local_200,&local_1e0,padding);
  _Var1._M_p = local_200._M_dataplus._M_p;
  local_230.data_ = local_200._M_dataplus._M_p;
  local_230.size_ = local_200._M_string_length;
  local_1c0.ok_ = true;
  local_1c0.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/logging_test.cc"
  ;
  local_1c0.line_ = 0x30;
  std::__cxx11::stringstream::stringstream((stringstream *)&local_1c0.ss_);
  b = ConsumeDecimalNumber(&local_230,&local_210);
  test::Tester::Is(&local_1c0,b,"ConsumeDecimalNumber(&output, &result)");
  test::Tester::~Tester(&local_1c0);
  local_1c0.ok_ = true;
  local_1c0.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/logging_test.cc"
  ;
  local_1c0.line_ = 0x31;
  std::__cxx11::stringstream::stringstream((stringstream *)&local_1c0.ss_);
  test::Tester::IsEq<unsigned_long,unsigned_long>(&local_1c0,&local_208,&local_210);
  test::Tester::~Tester(&local_1c0);
  local_1c0.ok_ = true;
  local_1c0.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/logging_test.cc"
  ;
  local_1c0.line_ = 0x32;
  std::__cxx11::stringstream::stringstream((stringstream *)&local_1c0.ss_);
  local_218 = local_1e0._M_string_length;
  local_220 = (long)local_230.data_ - (long)_Var1._M_p;
  test::Tester::IsEq<unsigned_long,long>(&local_1c0,&local_218,(long *)&local_220);
  test::Tester::~Tester(&local_1c0);
  local_1c0.ok_ = true;
  local_1c0.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/logging_test.cc"
  ;
  local_1c0.line_ = 0x33;
  std::__cxx11::stringstream::stringstream((stringstream *)&local_1c0.ss_);
  local_218 = padding->_M_string_length;
  local_220 = local_230.size_;
  test::Tester::IsEq<unsigned_long,unsigned_long>(&local_1c0,&local_218,&local_220);
  test::Tester::~Tester(&local_1c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2) {
    operator_delete(local_200._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
    operator_delete(local_1e0._M_dataplus._M_p);
  }
  return;
}

Assistant:

void ConsumeDecimalNumberRoundtripTest(uint64_t number,
                                       const std::string& padding = "") {
  std::string decimal_number = NumberToString(number);
  std::string input_string = decimal_number + padding;
  Slice input(input_string);
  Slice output = input;
  uint64_t result;
  ASSERT_TRUE(ConsumeDecimalNumber(&output, &result));
  ASSERT_EQ(number, result);
  ASSERT_EQ(decimal_number.size(), output.data() - input.data());
  ASSERT_EQ(padding.size(), output.size());
}